

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::orientationReset
          (DeadReckoningCalculator *this,EulerAngles *Orientation)

{
  KFLOAT32 KVar1;
  KFLOAT32 KVar2;
  KFLOAT32 KVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  KFLOAT64 sinTheta_sinPsi;
  KFLOAT64 sinTheta_cosPsi;
  KFLOAT64 f32SinPhi;
  KFLOAT64 f32SinTheta;
  KFLOAT64 f32SinPsi;
  KFLOAT64 f32CosPhi;
  KFLOAT64 f32CosTheta;
  KFLOAT64 f32CosPsi;
  KFLOAT32 f32Phi;
  KFLOAT32 f32Theta;
  KFLOAT32 f32Psi;
  EulerAngles *Orientation_local;
  DeadReckoningCalculator *this_local;
  
  DATA_TYPE::EulerAngles::operator=(&this->m_initOrientation,Orientation);
  KVar1 = DATA_TYPE::EulerAngles::GetPsiInRadians(Orientation);
  KVar2 = DATA_TYPE::EulerAngles::GetThetaInRadians(Orientation);
  KVar3 = DATA_TYPE::EulerAngles::GetPhiInRadians(Orientation);
  dVar10 = std::cos((double)(ulong)(uint)KVar1);
  fVar4 = SUB84(dVar10,0);
  dVar10 = std::cos((double)(ulong)(uint)KVar2);
  fVar5 = SUB84(dVar10,0);
  dVar10 = std::cos((double)(ulong)(uint)KVar3);
  fVar6 = SUB84(dVar10,0);
  dVar10 = std::sin((double)(ulong)(uint)KVar1);
  fVar7 = SUB84(dVar10,0);
  dVar10 = std::sin((double)(ulong)(uint)KVar2);
  fVar8 = SUB84(dVar10,0);
  dVar10 = std::sin((double)(ulong)(uint)KVar3);
  fVar9 = SUB84(dVar10,0);
  (this->m_initOrientationMatrix).Data[0][0] = fVar5 * fVar4;
  (this->m_initOrientationMatrix).Data[0][1] = fVar5 * fVar7;
  (this->m_initOrientationMatrix).Data[0][2] = -fVar8;
  (this->m_initOrientationMatrix).Data[1][0] = fVar9 * fVar8 * fVar4 + -(fVar6 * fVar7);
  (this->m_initOrientationMatrix).Data[1][1] = fVar9 * fVar8 * fVar7 + fVar6 * fVar4;
  (this->m_initOrientationMatrix).Data[1][2] = fVar9 * fVar5;
  (this->m_initOrientationMatrix).Data[2][0] = fVar6 * fVar8 * fVar4 + fVar9 * fVar7;
  (this->m_initOrientationMatrix).Data[2][1] = fVar6 * fVar8 * fVar7 + -(fVar9 * fVar4);
  (this->m_initOrientationMatrix).Data[2][2] = fVar6 * fVar5;
  memcpy(&this->m_initOrientationMatrixTranspose,&this->m_initOrientationMatrix,0x24);
  Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::inPlanceTranspose
            (&this->m_initOrientationMatrixTranspose);
  computeRotationAxis(this,&this->m_initOrientationMatrix);
  return;
}

Assistant:

void DeadReckoningCalculator::orientationReset( const EulerAngles & Orientation )
{
    m_initOrientation = Orientation;

    const KFLOAT32 f32Psi = Orientation.GetPsiInRadians();
    const KFLOAT32 f32Theta = Orientation.GetThetaInRadians();
    const KFLOAT32 f32Phi = Orientation.GetPhiInRadians();

    const KFLOAT64 f32CosPsi = cos( f32Psi );
    const KFLOAT64 f32CosTheta = cos( f32Theta );
    const KFLOAT64 f32CosPhi = cos( f32Phi );
    const KFLOAT64 f32SinPsi = sin( f32Psi );
    const KFLOAT64 f32SinTheta = sin( f32Theta );
    const KFLOAT64 f32SinPhi = sin( f32Phi );

    // Create the orientation matrix

    // RI - could use osg mathematics for Euler to rotation matrix computation
    const KFLOAT64 sinTheta_cosPsi = f32SinTheta * f32CosPsi;
    const KFLOAT64 sinTheta_sinPsi = f32SinTheta * f32SinPsi;

    m_initOrientationMatrix.Data[0][0] = f32CosTheta * f32CosPsi;
    m_initOrientationMatrix.Data[0][1] = f32CosTheta * f32SinPsi;
    m_initOrientationMatrix.Data[0][2] = -f32SinTheta;

    m_initOrientationMatrix.Data[1][0] = ( f32SinPhi * sinTheta_cosPsi ) - ( f32CosPhi * f32SinPsi );
    m_initOrientationMatrix.Data[1][1] = ( f32SinPhi * sinTheta_sinPsi ) + ( f32CosPhi * f32CosPsi );
    m_initOrientationMatrix.Data[1][2] = f32SinPhi * f32CosTheta;

    m_initOrientationMatrix.Data[2][0] = ( f32CosPhi * sinTheta_cosPsi ) + ( f32SinPhi * f32SinPsi );
    m_initOrientationMatrix.Data[2][1] = ( f32CosPhi * sinTheta_sinPsi ) - ( f32SinPhi * f32CosPsi );
    m_initOrientationMatrix.Data[2][2] = f32CosPhi * f32CosTheta;

    m_initOrientationMatrixTranspose = m_initOrientationMatrix;
    m_initOrientationMatrixTranspose.inPlanceTranspose();

    computeRotationAxis(m_initOrientationMatrix);
}